

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers_iterator.hpp
# Opt level: O2

void __thiscall
asio::buffers_iterator<asio::const_buffers_1,_char>::advance
          (buffers_iterator<asio::const_buffers_1,_char> *this,ptrdiff_t n)

{
  buffer_sequence_iterator_type pcVar1;
  ulong uVar2;
  void *pvVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  buffer_sequence_iterator_type pcVar7;
  size_t sVar8;
  buffer_sequence_iterator_type pcVar9;
  long lVar10;
  
  if (n < 1) {
    if (-1 < n) {
      return;
    }
    uVar6 = -n;
    pcVar1 = this->begin_;
    sVar4 = this->position_;
    uVar5 = this->current_buffer_position_;
    pcVar7 = this->current_;
LAB_00198cbe:
    sVar8 = uVar5 - uVar6;
    if (uVar5 < uVar6) {
      sVar4 = sVar4 - uVar5;
      this->position_ = sVar4;
      if (pcVar7 == pcVar1) {
        sVar8 = 0;
        goto LAB_00198c9a;
      }
      uVar6 = uVar6 - uVar5;
      pcVar9 = pcVar7;
      do {
        if (pcVar9 == pcVar1) goto LAB_00198cbe;
        uVar2 = pcVar9[-1].size_;
        pcVar9 = pcVar9 + -1;
      } while (uVar2 == 0);
      pvVar3 = pcVar9->data_;
      this->current_ = pcVar9;
      (this->current_buffer_).data_ = pvVar3;
      (this->current_buffer_).size_ = uVar2;
      this->current_buffer_position_ = uVar2;
      uVar5 = uVar2;
      pcVar7 = pcVar9;
      goto LAB_00198cbe;
    }
    this->position_ = sVar4 - uVar6;
  }
  else {
    sVar8 = this->current_buffer_position_;
    pcVar1 = this->end_;
    sVar4 = this->position_;
    pcVar7 = this->current_;
    while( true ) {
      pcVar9 = pcVar7 + 1;
      lVar10 = (this->current_buffer_).size_ - sVar8;
      if (n < lVar10) break;
      sVar4 = sVar4 + lVar10;
      this->position_ = sVar4;
      this->current_ = pcVar9;
      if (pcVar9 == pcVar1) {
        (this->current_buffer_).data_ = (void *)0x0;
        (this->current_buffer_).size_ = 0;
        this->current_buffer_position_ = 0;
        return;
      }
      sVar8 = pcVar7[1].size_;
      (this->current_buffer_).data_ = pcVar9->data_;
      (this->current_buffer_).size_ = sVar8;
      this->current_buffer_position_ = 0;
      sVar8 = 0;
      n = n - lVar10;
      pcVar7 = pcVar9;
    }
    this->position_ = sVar4 + n;
    sVar8 = sVar8 + n;
  }
LAB_00198c9a:
  this->current_buffer_position_ = sVar8;
  return;
}

Assistant:

void advance(std::ptrdiff_t n)
  {
    if (n > 0)
    {
      ASIO_ASSERT(current_ != end_ && "iterator out of bounds");
      for (;;)
      {
        std::ptrdiff_t current_buffer_balance
          = current_buffer_.size() - current_buffer_position_;

        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_balance > n)
        {
          position_ += n;
          current_buffer_position_ += n;
          return;
        }

        // Update position.
        n -= current_buffer_balance;
        position_ += current_buffer_balance;

        // Move to next buffer. If it is empty then it will be skipped on the
        // next iteration of this loop.
        if (++current_ == end_)
        {
          ASIO_ASSERT(n == 0 && "iterator out of bounds");
          current_buffer_ = buffer_type();
          current_buffer_position_ = 0;
          return;
        }
        current_buffer_ = *current_;
        current_buffer_position_ = 0;
      }
    }
    else if (n < 0)
    {
      std::size_t abs_n = -n;
      ASIO_ASSERT(position_ >= abs_n && "iterator out of bounds");
      for (;;)
      {
        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_position_ >= abs_n)
        {
          position_ -= abs_n;
          current_buffer_position_ -= abs_n;
          return;
        }

        // Update position.
        abs_n -= current_buffer_position_;
        position_ -= current_buffer_position_;

        // Check if we've reached the beginning of the buffers.
        if (current_ == begin_)
        {
          ASIO_ASSERT(abs_n == 0 && "iterator out of bounds");
          current_buffer_position_ = 0;
          return;
        }

        // Find the previous non-empty buffer.
        buffer_sequence_iterator_type iter = current_;
        while (iter != begin_)
        {
          --iter;
          buffer_type buffer = *iter;
          std::size_t buffer_size = buffer.size();
          if (buffer_size > 0)
          {
            current_ = iter;
            current_buffer_ = buffer;
            current_buffer_position_ = buffer_size;
            break;
          }
        }
      }
    }
  }